

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_8x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar16;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar17;
  ushort uVar22;
  ushort uVar24;
  ushort uVar26;
  ushort uVar28;
  ushort uVar30;
  ushort uVar32;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ushort uVar18;
  ushort uVar23;
  ushort uVar25;
  ushort uVar27;
  ushort uVar29;
  ushort uVar31;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar21 [16];
  int y_mask_2;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  int y_mask;
  __m128i top;
  __m128i round;
  __m128i scaled_bottom_left4;
  __m128i scaled_bottom_left3;
  __m128i scaled_bottom_left2;
  __m128i scaled_bottom_left1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i scale;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i bottom_left;
  __m128i zero;
  __m128i pred_3;
  __m128i pred_sum_3;
  __m128i pred_2;
  __m128i pred_sum_2;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  __m128i weighted_px_1;
  __m128i weighted_px_2;
  __m128i weighted_px_3;
  undefined4 local_c3c;
  undefined4 local_bfc;
  undefined4 local_bbc;
  undefined4 local_b7c;
  undefined8 local_a30;
  undefined1 local_898;
  undefined1 uStack_897;
  undefined1 uStack_896;
  undefined1 uStack_895;
  undefined1 uStack_894;
  undefined1 uStack_893;
  undefined1 uStack_892;
  undefined1 uStack_891;
  undefined2 uStack_782;
  undefined2 uStack_77a;
  undefined2 uStack_762;
  undefined2 uStack_75a;
  undefined2 uStack_742;
  undefined2 uStack_73a;
  undefined2 uStack_726;
  undefined2 uStack_724;
  undefined2 uStack_722;
  undefined2 uStack_71e;
  undefined2 uStack_71c;
  undefined2 uStack_71a;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined2 uStack_22c;
  undefined2 uStack_22a;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  __m128i scaled_bottom_left_y_3;
  __m128i weights_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i scaled_bottom_left_y_2;
  __m128i weights_y_2;
  __m128i y_select_2;
  
  bVar2 = *(byte *)(in_RCX + 0x1f);
  uVar16 = CONCAT11(0,bVar2);
  uStack_726 = (ushort)bVar2;
  uStack_724 = (ushort)bVar2;
  uStack_722 = (ushort)bVar2;
  uStack_71e = (ushort)bVar2;
  uStack_71c = (ushort)bVar2;
  uStack_71a = (ushort)bVar2;
  uStack_742 = (ushort)bVar2;
  uStack_73a = (ushort)bVar2;
  uStack_762 = (ushort)bVar2;
  uStack_75a = (ushort)bVar2;
  uStack_782 = (ushort)bVar2;
  uStack_77a = (ushort)bVar2;
  uVar1 = *in_RDX;
  local_898 = (byte)uVar1;
  uStack_897 = (byte)((ulong)uVar1 >> 8);
  uStack_896 = (byte)((ulong)uVar1 >> 0x10);
  uStack_895 = (byte)((ulong)uVar1 >> 0x18);
  uStack_894 = (byte)((ulong)uVar1 >> 0x20);
  uStack_893 = (byte)((ulong)uVar1 >> 0x28);
  uStack_892 = (byte)((ulong)uVar1 >> 0x30);
  uStack_891 = (byte)((ulong)uVar1 >> 0x38);
  local_a30 = in_RDI;
  for (local_b7c = 0x1000100; local_b7c < 0xf0e0f0f; local_b7c = local_b7c + 0x2020202) {
    auVar15._8_7_ = 0x9d00a900b600c4;
    auVar15._0_8_ = 0xd200e100f000ff;
    auVar15[0xf] = 0;
    auVar14._8_8_ = CONCAT44(local_b7c,local_b7c);
    auVar14._0_8_ = CONCAT44(local_b7c,local_b7c);
    auVar19 = pshufb(auVar15,auVar14);
    auVar13._2_2_ = uStack_726 * 0x10;
    auVar13._0_2_ = uVar16;
    auVar13._4_2_ = uStack_724 * 0x1f;
    auVar13._6_2_ = uStack_722 * 0x2e;
    auVar13._10_2_ = uStack_71e * 0x4a;
    auVar13._8_2_ = uVar16 * 0x3c;
    auVar13._12_2_ = uStack_71c * 0x57;
    auVar13._14_2_ = uStack_71a * 99;
    auVar12._8_8_ = CONCAT44(local_b7c,local_b7c);
    auVar12._0_8_ = CONCAT44(local_b7c,local_b7c);
    auVar20 = pshufb(auVar13,auVar12);
    uStack_216 = (ushort)uStack_897;
    uStack_214 = (ushort)uStack_896;
    uStack_212 = (ushort)uStack_895;
    uStack_20e = (ushort)uStack_893;
    uStack_20c = (ushort)uStack_892;
    uStack_20a = (ushort)uStack_891;
    local_228 = auVar19._0_2_;
    uStack_226 = auVar19._2_2_;
    uStack_224 = auVar19._4_2_;
    uStack_222 = auVar19._6_2_;
    uStack_220 = auVar19._8_2_;
    uStack_21e = auVar19._10_2_;
    uStack_21c = auVar19._12_2_;
    uStack_21a = auVar19._14_2_;
    local_238 = auVar20._0_2_;
    uStack_236 = auVar20._2_2_;
    uStack_234 = auVar20._4_2_;
    uStack_232 = auVar20._6_2_;
    uStack_230 = auVar20._8_2_;
    uStack_22e = auVar20._10_2_;
    uStack_22c = auVar20._12_2_;
    uStack_22a = auVar20._14_2_;
    uVar17 = local_238 + (ushort)local_898 * local_228 + 0x80;
    uVar22 = uStack_236 + uStack_216 * uStack_226 + 0x80;
    uVar24 = uStack_234 + uStack_214 * uStack_224 + 0x80;
    uVar26 = uStack_232 + uStack_212 * uStack_222 + 0x80;
    uVar28 = uStack_230 + (ushort)uStack_894 * uStack_220 + 0x80;
    uVar30 = uStack_22e + uStack_20e * uStack_21e + 0x80;
    uVar32 = uStack_22c + uStack_20c * uStack_21c + 0x80;
    uVar34 = uStack_22a + uStack_20a * uStack_21a + 0x80;
    uVar18 = uVar17 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    *local_a30 = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                            (0xff < uVar31),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                              (char)(uVar26 >> 8) - (0xff < uVar27),
                                                              CONCAT12((uVar25 != 0) *
                                                                       (uVar25 < 0x100) *
                                                                       (char)(uVar24 >> 8) -
                                                                       (0xff < uVar25),
                                                                       CONCAT11((uVar23 != 0) *
                                                                                (uVar23 < 0x100) *
                                                                                (char)(uVar22 >> 8)
                                                                                - (0xff < uVar23),
                                                                                (uVar18 != 0) *
                                                                                (uVar18 < 0x100) *
                                                                                (char)(uVar17 >> 8)
                                                                                - (0xff < uVar18))))
                                                    ))));
    local_a30 = (undefined8 *)(in_RSI + (long)local_a30);
  }
  for (local_bbc = 0x1000100; local_bbc < 0xf0e0f0f; local_bbc = local_bbc + 0x2020202) {
    auVar11._8_7_ = 0x4a0053005c0065;
    auVar11._0_8_ = 0x6f007a00850091;
    auVar11[0xf] = 0;
    auVar10._8_8_ = CONCAT44(local_bbc,local_bbc);
    auVar10._0_8_ = CONCAT44(local_bbc,local_bbc);
    auVar19 = pshufb(auVar11,auVar10);
    auVar9._2_2_ = uStack_726 * 0x7b;
    auVar9._0_2_ = uVar16 * 0x6f;
    auVar9._4_2_ = uStack_724 * 0x86;
    auVar9._6_2_ = uStack_742 * 0x91;
    auVar9._10_2_ = uStack_71e * 0xa4;
    auVar9._8_2_ = uVar16 * 0x9b;
    auVar9._12_2_ = uStack_71c * 0xad;
    auVar9._14_2_ = uStack_73a * 0xb6;
    auVar8._8_8_ = CONCAT44(local_bbc,local_bbc);
    auVar8._0_8_ = CONCAT44(local_bbc,local_bbc);
    auVar20 = pshufb(auVar9,auVar8);
    uStack_196 = (ushort)uStack_897;
    uStack_194 = (ushort)uStack_896;
    uStack_192 = (ushort)uStack_895;
    uStack_18e = (ushort)uStack_893;
    uStack_18c = (ushort)uStack_892;
    uStack_18a = (ushort)uStack_891;
    local_1a8 = auVar19._0_2_;
    uStack_1a6 = auVar19._2_2_;
    uStack_1a4 = auVar19._4_2_;
    uStack_1a2 = auVar19._6_2_;
    uStack_1a0 = auVar19._8_2_;
    uStack_19e = auVar19._10_2_;
    uStack_19c = auVar19._12_2_;
    uStack_19a = auVar19._14_2_;
    local_1b8 = auVar20._0_2_;
    uStack_1b6 = auVar20._2_2_;
    uStack_1b4 = auVar20._4_2_;
    uStack_1b2 = auVar20._6_2_;
    uStack_1b0 = auVar20._8_2_;
    uStack_1ae = auVar20._10_2_;
    uStack_1ac = auVar20._12_2_;
    uStack_1aa = auVar20._14_2_;
    uVar17 = local_1b8 + (ushort)local_898 * local_1a8 + 0x80;
    uVar22 = uStack_1b6 + uStack_196 * uStack_1a6 + 0x80;
    uVar24 = uStack_1b4 + uStack_194 * uStack_1a4 + 0x80;
    uVar26 = uStack_1b2 + uStack_192 * uStack_1a2 + 0x80;
    uVar28 = uStack_1b0 + (ushort)uStack_894 * uStack_1a0 + 0x80;
    uVar30 = uStack_1ae + uStack_18e * uStack_19e + 0x80;
    uVar32 = uStack_1ac + uStack_18c * uStack_19c + 0x80;
    uVar34 = uStack_1aa + uStack_18a * uStack_19a + 0x80;
    uVar18 = uVar17 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    *local_a30 = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                            (0xff < uVar31),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                              (char)(uVar26 >> 8) - (0xff < uVar27),
                                                              CONCAT12((uVar25 != 0) *
                                                                       (uVar25 < 0x100) *
                                                                       (char)(uVar24 >> 8) -
                                                                       (0xff < uVar25),
                                                                       CONCAT11((uVar23 != 0) *
                                                                                (uVar23 < 0x100) *
                                                                                (char)(uVar22 >> 8)
                                                                                - (0xff < uVar23),
                                                                                (uVar18 != 0) *
                                                                                (uVar18 < 0x100) *
                                                                                (char)(uVar17 >> 8)
                                                                                - (0xff < uVar18))))
                                                    ))));
    local_a30 = (undefined8 *)(in_RSI + (long)local_a30);
  }
  for (local_bfc = 0x1000100; local_bfc < 0xf0e0f0f; local_bfc = local_bfc + 0x2020202) {
    auVar7._8_7_ = 0x19001d00220027;
    auVar7._0_8_ = 0x2d0034003b0042;
    auVar7[0xf] = 0;
    auVar6._8_8_ = CONCAT44(local_bfc,local_bfc);
    auVar6._0_8_ = CONCAT44(local_bfc,local_bfc);
    auVar19 = pshufb(auVar7,auVar6);
    auVar5._2_2_ = uStack_726 * 0xc5;
    auVar5._0_2_ = uVar16 * 0xbe;
    auVar5._4_2_ = uStack_724 * 0xcc;
    auVar5._6_2_ = uStack_762 * 0xd3;
    auVar5._10_2_ = uStack_71e * 0xde;
    auVar5._8_2_ = uVar16 * 0xd9;
    auVar5._12_2_ = uStack_71c * 0xe3;
    auVar5._14_2_ = uStack_75a * 0xe7;
    auVar4._8_8_ = CONCAT44(local_bfc,local_bfc);
    auVar4._0_8_ = CONCAT44(local_bfc,local_bfc);
    auVar20 = pshufb(auVar5,auVar4);
    uStack_116 = (ushort)uStack_897;
    uStack_114 = (ushort)uStack_896;
    uStack_112 = (ushort)uStack_895;
    uStack_10e = (ushort)uStack_893;
    uStack_10c = (ushort)uStack_892;
    uStack_10a = (ushort)uStack_891;
    local_128 = auVar19._0_2_;
    uStack_126 = auVar19._2_2_;
    uStack_124 = auVar19._4_2_;
    uStack_122 = auVar19._6_2_;
    uStack_120 = auVar19._8_2_;
    uStack_11e = auVar19._10_2_;
    uStack_11c = auVar19._12_2_;
    uStack_11a = auVar19._14_2_;
    local_138 = auVar20._0_2_;
    uStack_136 = auVar20._2_2_;
    uStack_134 = auVar20._4_2_;
    uStack_132 = auVar20._6_2_;
    uStack_130 = auVar20._8_2_;
    uStack_12e = auVar20._10_2_;
    uStack_12c = auVar20._12_2_;
    uStack_12a = auVar20._14_2_;
    uVar17 = local_138 + (ushort)local_898 * local_128 + 0x80;
    uVar22 = uStack_136 + uStack_116 * uStack_126 + 0x80;
    uVar24 = uStack_134 + uStack_114 * uStack_124 + 0x80;
    uVar26 = uStack_132 + uStack_112 * uStack_122 + 0x80;
    uVar28 = uStack_130 + (ushort)uStack_894 * uStack_120 + 0x80;
    uVar30 = uStack_12e + uStack_10e * uStack_11e + 0x80;
    uVar32 = uStack_12c + uStack_10c * uStack_11c + 0x80;
    uVar34 = uStack_12a + uStack_10a * uStack_11a + 0x80;
    uVar18 = uVar17 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    *local_a30 = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                            (0xff < uVar31),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                              (char)(uVar26 >> 8) - (0xff < uVar27),
                                                              CONCAT12((uVar25 != 0) *
                                                                       (uVar25 < 0x100) *
                                                                       (char)(uVar24 >> 8) -
                                                                       (0xff < uVar25),
                                                                       CONCAT11((uVar23 != 0) *
                                                                                (uVar23 < 0x100) *
                                                                                (char)(uVar22 >> 8)
                                                                                - (0xff < uVar23),
                                                                                (uVar18 != 0) *
                                                                                (uVar18 < 0x100) *
                                                                                (char)(uVar17 >> 8)
                                                                                - (0xff < uVar18))))
                                                    ))));
    local_a30 = (undefined8 *)(in_RSI + (long)local_a30);
  }
  for (local_c3c = 0x1000100; local_c3c < 0xf0e0f0f; local_c3c = local_c3c + 0x2020202) {
    auVar3._8_7_ = 0x800080009000a;
    auVar3._0_8_ = 0xc000e00110015;
    auVar3[0xf] = 0;
    auVar21._8_8_ = CONCAT44(local_c3c,local_c3c);
    auVar21._0_8_ = CONCAT44(local_c3c,local_c3c);
    auVar21 = pshufb(auVar3,auVar21);
    auVar20._2_2_ = uStack_726 * 0xef;
    auVar20._0_2_ = uVar16 * 0xeb;
    auVar20._4_2_ = uStack_724 * 0xf2;
    auVar20._6_2_ = uStack_782 * 0xf4;
    auVar20._10_2_ = uStack_71e * 0xf7;
    auVar20._8_2_ = uVar16 * 0xf6;
    auVar20._12_2_ = uStack_71c * 0xf8;
    auVar20._14_2_ = uStack_77a * 0xf8;
    auVar19._8_8_ = CONCAT44(local_c3c,local_c3c);
    auVar19._0_8_ = CONCAT44(local_c3c,local_c3c);
    auVar19 = pshufb(auVar20,auVar19);
    uStack_96 = (ushort)uStack_897;
    uStack_94 = (ushort)uStack_896;
    uStack_92 = (ushort)uStack_895;
    uStack_8e = (ushort)uStack_893;
    uStack_8c = (ushort)uStack_892;
    uStack_8a = (ushort)uStack_891;
    local_a8 = auVar21._0_2_;
    uStack_a6 = auVar21._2_2_;
    uStack_a4 = auVar21._4_2_;
    uStack_a2 = auVar21._6_2_;
    uStack_a0 = auVar21._8_2_;
    uStack_9e = auVar21._10_2_;
    uStack_9c = auVar21._12_2_;
    uStack_9a = auVar21._14_2_;
    local_b8 = auVar19._0_2_;
    uStack_b6 = auVar19._2_2_;
    uStack_b4 = auVar19._4_2_;
    uStack_b2 = auVar19._6_2_;
    uStack_b0 = auVar19._8_2_;
    uStack_ae = auVar19._10_2_;
    uStack_ac = auVar19._12_2_;
    uStack_aa = auVar19._14_2_;
    uVar17 = local_b8 + (ushort)local_898 * local_a8 + 0x80;
    uVar22 = uStack_b6 + uStack_96 * uStack_a6 + 0x80;
    uVar24 = uStack_b4 + uStack_94 * uStack_a4 + 0x80;
    uVar26 = uStack_b2 + uStack_92 * uStack_a2 + 0x80;
    uVar28 = uStack_b0 + (ushort)uStack_894 * uStack_a0 + 0x80;
    uVar30 = uStack_ae + uStack_8e * uStack_9e + 0x80;
    uVar32 = uStack_ac + uStack_8c * uStack_9c + 0x80;
    uVar34 = uStack_aa + uStack_8a * uStack_9a + 0x80;
    uVar18 = uVar17 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar35 = uVar34 >> 8;
    *local_a30 = CONCAT17((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) - (0xff < uVar35),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                            (0xff < uVar31),
                                            CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                     (char)(uVar28 >> 8) - (0xff < uVar29),
                                                     CONCAT13((uVar27 != 0) * (uVar27 < 0x100) *
                                                              (char)(uVar26 >> 8) - (0xff < uVar27),
                                                              CONCAT12((uVar25 != 0) *
                                                                       (uVar25 < 0x100) *
                                                                       (char)(uVar24 >> 8) -
                                                                       (0xff < uVar25),
                                                                       CONCAT11((uVar23 != 0) *
                                                                                (uVar23 < 0x100) *
                                                                                (char)(uVar22 >> 8)
                                                                                - (0xff < uVar23),
                                                                                (uVar18 != 0) *
                                                                                (uVar18 < 0x100) *
                                                                                (char)(uVar17 >> 8)
                                                                                - (0xff < uVar18))))
                                                    ))));
    local_a30 = (undefined8 *)(in_RSI + (long)local_a30);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_8x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
}